

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerFunctionExit(Lowerer *this,Instr *funcExit)

{
  bool bVar1;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  AddrOpnd *opndArg;
  Instr *callInstr;
  Instr *funcExit_local;
  Lowerer *this_local;
  
  bVar1 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar1) {
    this_00 = IR::Instr::New(Call,this->m_func);
    newSrc = IR::HelperCallOpnd::New(HelperSimpleCleanImplicitCallFlags,this->m_func);
    IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(funcExit->m_prev,this_00);
    opndArg = CreateFunctionBodyOpnd(this,funcExit->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,this_00,&opndArg->super_Opnd);
    LowererMD::LowerCall(&this->m_lowererMD,this_00,0);
  }
  return;
}

Assistant:

void Lowerer::LowerFunctionExit(IR::Instr* funcExit)
{
    if (!m_func->DoSimpleJitDynamicProfile())
    {
        return;
    }

    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, m_func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperSimpleCleanImplicitCallFlags, m_func));
    funcExit->m_prev->InsertBefore(callInstr);

    m_lowererMD.LoadHelperArgument(callInstr, CreateFunctionBodyOpnd(funcExit->m_func));
    m_lowererMD.LowerCall(callInstr, 0);
}